

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

Bond * __thiscall OpenMD::SelectionManager::beginUnselectedBond(SelectionManager *this,int *i)

{
  pointer pOVar1;
  long lVar2;
  pointer ppBVar3;
  Bond *pBVar4;
  int iVar5;
  ulong uVar6;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_>;
  iVar5 = (*(int *)&(((_Bit_iterator *)
                     ((long)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x10))->
                    super__Bit_iterator_base)._M_p - (int)lVar2) * 8;
  *i = 0;
  if (0 < (int)(*(uint *)((long)&pOVar1[1].bitset_.super__Bvector_base<std::allocator<bool>_> + 0x18
                         ) + iVar5)) {
    ppBVar3 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      if (((*(ulong *)(lVar2 + (uVar6 >> 6 & 0x3ffffff) * 8) >> (uVar6 & 0x3f) & 1) == 0) &&
         (pBVar4 = ppBVar3[uVar6], pBVar4 != (Bond *)0x0)) {
        return pBVar4;
      }
      uVar6 = uVar6 + 1;
      *i = (int)uVar6;
    } while ((long)uVar6 <
             (long)(int)(*(uint *)((long)&pOVar1[1].bitset_.
                                          super__Bvector_base<std::allocator<bool>_> + 0x18) + iVar5
                        ));
  }
  return (Bond *)0x0;
}

Assistant:

Bond* SelectionManager::beginUnselectedBond(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BOND].size())) {
      if (!ss_.bitsets_[BOND][i]) {
        // check that this processor owns this bond
        if (bonds_[i] != NULL) return bonds_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BOND].firstOffBit();
    return i == -1 ? NULL : bonds_[i];
#endif
  }